

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_3udex Internal_StretchSlantWeightDex(uint max_stretch_dex,uint max_weight_dex,ON_Font *f)

{
  ON_3udex OVar1;
  Stretch SVar2;
  Style SVar3;
  Weight WVar4;
  uint iValue;
  uint kValue;
  bool bVar5;
  uint weight_dex;
  uint slant_dex;
  uint stretch_dex;
  ON_Font *f_local;
  uint max_weight_dex_local;
  uint max_stretch_dex_local;
  uint local_c;
  
  if (f != (ON_Font *)0x0) {
    SVar2 = ON_Font::FontStretch(f);
    iValue = (uint)SVar2;
    if ((iValue != 0) && (iValue < max_stretch_dex)) {
      SVar3 = ON_Font::FontStyle(f);
      bVar5 = true;
      if (SVar3 != Italic) {
        SVar3 = ON_Font::FontStyle(f);
        bVar5 = SVar3 == Oblique;
      }
      WVar4 = ON_Font::FontWeight(f);
      kValue = (uint)WVar4;
      if ((kValue != 0) && (kValue < max_weight_dex)) {
        ON_3udex::ON_3udex((ON_3udex *)&max_weight_dex_local,iValue,(uint)bVar5,kValue);
        goto LAB_0062c651;
      }
    }
  }
  ON_3udex::ON_3udex((ON_3udex *)&max_weight_dex_local,0xffffffff,0xffffffff,0xffffffff);
LAB_0062c651:
  OVar1.k = local_c;
  OVar1.i = max_weight_dex_local;
  OVar1.j = max_stretch_dex_local;
  return OVar1;
}

Assistant:

ON_3udex Internal_StretchSlantWeightDex(unsigned max_stretch_dex, unsigned max_weight_dex, const ON_Font* f)
{
  for (;;)
  {
    if (nullptr == f)
      break;
    const unsigned stretch_dex = static_cast<unsigned char>(f->FontStretch());
    if (stretch_dex < 1 || stretch_dex >= max_stretch_dex)
      break;
    const unsigned slant_dex = (ON_Font::Style::Italic == f->FontStyle() || ON_Font::Style::Oblique == f->FontStyle())
      ? 1U
      : 0U;
    const unsigned weight_dex = static_cast<unsigned char>(f->FontWeight());
    if (weight_dex < 1 || weight_dex >= max_weight_dex)
      break;
    return ON_3udex(stretch_dex, slant_dex, weight_dex);
  }
  return ON_3udex(ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX);
}